

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int setChildPtrmaps(MemPage *pPage)

{
  u8 uVar1;
  u8 uVar2;
  u8 uVar3;
  ushort uVar4;
  ushort uVar5;
  uint uVar6;
  BtShared *pBt;
  u8 *puVar7;
  ulong uVar8;
  int rc;
  int local_38;
  Pgno local_34;
  
  pBt = pPage->pBt;
  uVar1 = pPage->isInit;
  local_34 = pPage->pgno;
  local_38 = btreeInitPage(pPage);
  if (local_38 == 0) {
    uVar4 = pPage->nCell;
    if ((ulong)uVar4 != 0) {
      uVar8 = 0;
      do {
        uVar5 = pPage->maskPage;
        uVar2 = pPage->aCellIdx[uVar8 * 2];
        uVar3 = pPage->aCellIdx[uVar8 * 2 + 1];
        puVar7 = pPage->aData;
        ptrmapPutOvflPtr(pPage,puVar7 + (CONCAT11(uVar2,uVar3) & uVar5),&local_38);
        if (pPage->leaf == '\0') {
          uVar6 = *(uint *)(puVar7 + (CONCAT11(uVar2,uVar3) & uVar5));
          ptrmapPut(pBt,uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                        uVar6 << 0x18,'\x05',local_34,&local_38);
        }
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
    if (pPage->leaf == '\0') {
      uVar6 = *(uint *)(pPage->aData + (ulong)pPage->hdrOffset + 8);
      ptrmapPut(pBt,uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18,
                '\x05',local_34,&local_38);
    }
  }
  pPage->isInit = uVar1;
  return local_38;
}

Assistant:

static int setChildPtrmaps(MemPage *pPage){
  int i;                             /* Counter variable */
  int nCell;                         /* Number of cells in page pPage */
  int rc;                            /* Return code */
  BtShared *pBt = pPage->pBt;
  u8 isInitOrig = pPage->isInit;
  Pgno pgno = pPage->pgno;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  rc = btreeInitPage(pPage);
  if( rc!=SQLITE_OK ){
    goto set_child_ptrmaps_out;
  }
  nCell = pPage->nCell;

  for(i=0; i<nCell; i++){
    u8 *pCell = findCell(pPage, i);

    ptrmapPutOvflPtr(pPage, pCell, &rc);

    if( !pPage->leaf ){
      Pgno childPgno = get4byte(pCell);
      ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
    }
  }

  if( !pPage->leaf ){
    Pgno childPgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
  }

set_child_ptrmaps_out:
  pPage->isInit = isInitOrig;
  return rc;
}